

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IcePoint.cpp
# Opt level: O2

Point * __thiscall IceMaths::Point::UnitRandomVector(Point *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  udword uVar3;
  float fVar4;
  float fVar5;
  
  uVar3 = Rand();
  this->x = (float)uVar3 * 4.656613e-10 + -0.5;
  uVar3 = Rand();
  this->y = (float)uVar3 * 4.656613e-10 + -0.5;
  uVar3 = Rand();
  fVar4 = (float)uVar3 * 4.656613e-10 + -0.5;
  this->z = fVar4;
  uVar1 = this->x;
  uVar2 = this->y;
  fVar5 = fVar4 * fVar4 + (float)uVar1 * (float)uVar1 + (float)uVar2 * (float)uVar2;
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    fVar5 = 1.0 / SQRT(fVar5);
    this->x = fVar5 * (float)uVar1;
    this->y = fVar5 * (float)uVar2;
    this->z = fVar5 * fVar4;
  }
  return this;
}

Assistant:

Point& Point::UnitRandomVector()
{
	x = UnitRandomFloat() - 0.5f;
	y = UnitRandomFloat() - 0.5f;
	z = UnitRandomFloat() - 0.5f;
	Normalize();
	return *this;
}